

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall
despot::util::tinyxml::TiXmlPrinter::VisitExit(TiXmlPrinter *this,TiXmlElement *element)

{
  TiXmlNode *pTVar1;
  char *suffix;
  TiXmlElement *element_local;
  TiXmlPrinter *this_local;
  
  this->depth = this->depth + -1;
  pTVar1 = TiXmlNode::FirstChild(&element->super_TiXmlNode);
  if (pTVar1 != (TiXmlNode *)0x0) {
    if ((this->simpleTextPrint & 1U) == 0) {
      DoIndent(this);
    }
    else {
      this->simpleTextPrint = false;
    }
    TiXmlString::operator+=(&this->buffer,"</");
    suffix = TiXmlNode::Value(&element->super_TiXmlNode);
    TiXmlString::operator+=(&this->buffer,suffix);
    TiXmlString::operator+=(&this->buffer,">");
    DoLineBreak(this);
  }
  return true;
}

Assistant:

bool TiXmlPrinter::VisitExit(const TiXmlElement& element) {
	--depth;
	if (!element.FirstChild()) {
		// nothing.
	} else {
		if (simpleTextPrint) {
			simpleTextPrint = false;
		} else {
			DoIndent();
		}
		buffer += "</";
		buffer += element.Value();
		buffer += ">";
		DoLineBreak();
	}
	return true;
}